

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

int av1_calc_iframe_target_size_one_pass_cbr(AV1_COMP *cpi)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  
  if ((cpi->common).current_frame.frame_number == 0) {
    lVar6 = (cpi->ppi->p_rc).starting_buffer_level;
    lVar9 = 0x7fffffff;
    if (lVar6 < 0x100000000) {
      lVar9 = (long)(int)((ulong)(lVar6 - (lVar6 >> 0x3f)) >> 1);
      uVar3 = (cpi->svc).number_temporal_layers;
      if ((1 < (int)uVar3) && (lVar9 < 0x1fffffff)) {
        bVar7 = 2;
        if (uVar3 < 4) {
          bVar7 = (char)uVar3 - 1;
        }
        lVar9 = lVar9 << (bVar7 & 0x3f);
      }
    }
  }
  else {
    dVar1 = cpi->framerate;
    dVar10 = round(dVar1 + dVar1 + -16.0);
    iVar8 = 0x20;
    if (0x20 < (int)dVar10) {
      iVar8 = (int)dVar10;
    }
    iVar2 = (cpi->rc).frames_since_key;
    iVar4 = (int)((double)(iVar2 * iVar8) / (dVar1 * 0.5));
    if (dVar1 * 0.5 <= (double)iVar2) {
      iVar4 = iVar8;
    }
    lVar9 = (long)(cpi->rc).avg_frame_bandwidth * (long)(iVar4 + 0x10) >> 4;
  }
  uVar5 = (ulong)(cpi->oxcf).rc_cfg.max_intra_bitrate_pct;
  if (uVar5 != 0) {
    lVar6 = (long)((long)(cpi->rc).avg_frame_bandwidth * uVar5) / 100;
    if (lVar6 < lVar9) {
      lVar9 = lVar6;
    }
  }
  lVar6 = (long)(cpi->rc).max_frame_bandwidth;
  if (lVar9 < lVar6) {
    lVar6 = lVar9;
  }
  return (int)lVar6;
}

Assistant:

int av1_calc_iframe_target_size_one_pass_cbr(const AV1_COMP *cpi) {
  const RATE_CONTROL *rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *p_rc = &cpi->ppi->p_rc;
  int64_t target;
  if (cpi->common.current_frame.frame_number == 0) {
    target = ((p_rc->starting_buffer_level / 2) > INT_MAX)
                 ? INT_MAX
                 : (int)(p_rc->starting_buffer_level / 2);
    if (cpi->svc.number_temporal_layers > 1 && target < (INT_MAX >> 2)) {
      target = target << AOMMIN(2, (cpi->svc.number_temporal_layers - 1));
    }
  } else {
    int kf_boost = 32;
    double framerate = cpi->framerate;

    kf_boost = AOMMAX(kf_boost, (int)round(2 * framerate - 16));
    if (rc->frames_since_key < framerate / 2) {
      kf_boost = (int)(kf_boost * rc->frames_since_key / (framerate / 2));
    }
    target = ((int64_t)(16 + kf_boost) * rc->avg_frame_bandwidth) >> 4;
  }
  return clamp_iframe_target_size(cpi, target);
}